

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

longdouble * cast_string_to_number(longdouble *__return_storage_ptr__,char *str)

{
  int *piVar1;
  longdouble *extraout_RAX;
  longdouble *plVar2;
  longdouble *local_20;
  char *ptr;
  
  piVar1 = __errno_location();
  *piVar1 = 0;
  strtold((char *)__return_storage_ptr__,(char **)&local_20);
  plVar2 = extraout_RAX;
  if (*piVar1 == 0) {
    plVar2 = local_20;
  }
  return plVar2;
}

Assistant:

static long double
cast_string_to_number(const char *str)
{
    long double num;
    char *ptr;

    errno = 0;
    num = strtold(str, &ptr);
    if (errno || *ptr) {
        num = NAN;
    }
    return num;
}